

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_c.h
# Opt level: O0

int MPIABI_Comm_spawn(char *command,char **argv,int maxprocs,MPIABI_Info info,int root,
                     MPIABI_Comm comm,MPIABI_Comm *intercomm,int *array_off_errcodes)

{
  int iVar1;
  ompi_info_t *poVar2;
  ompi_communicator_t *poVar3;
  ompi_communicator_t **ppoVar4;
  WPI_HandlePtr<ompi_communicator_t_*> local_50;
  WPI_Handle local_48 [8];
  WPI_Handle local_40 [8];
  MPIABI_Comm local_38;
  MPIABI_Comm comm_local;
  MPIABI_Info MStack_28;
  int root_local;
  MPIABI_Info info_local;
  char **ppcStack_18;
  int maxprocs_local;
  char **argv_local;
  char *command_local;
  
  local_38 = comm;
  comm_local._4_4_ = root;
  MStack_28 = info;
  info_local._4_4_ = maxprocs;
  ppcStack_18 = argv;
  argv_local = (char **)command;
  WPI_Handle<ompi_info_t_*>::WPI_Handle((WPI_Handle<ompi_info_t_*> *)local_40,info);
  poVar2 = WPI_Handle::operator_cast_to_ompi_info_t_(local_40);
  iVar1 = comm_local._4_4_;
  WPI_Handle<ompi_communicator_t_*>::WPI_Handle
            ((WPI_Handle<ompi_communicator_t_*> *)local_48,local_38);
  poVar3 = WPI_Handle::operator_cast_to_ompi_communicator_t_(local_48);
  WPI_HandlePtr<ompi_communicator_t_*>::WPI_HandlePtr(&local_50,intercomm);
  ppoVar4 = WPI_HandlePtr::operator_cast_to_ompi_communicator_t__((WPI_HandlePtr *)&local_50);
  iVar1 = MPI_Comm_spawn(command,argv,maxprocs,poVar2,iVar1,poVar3,ppoVar4,array_off_errcodes);
  WPI_HandlePtr<ompi_communicator_t_*>::~WPI_HandlePtr(&local_50);
  return iVar1;
}

Assistant:

int MPIABI_Comm_spawn(
  const char * command,
  char ** argv,
  int maxprocs,
  MPIABI_Info info,
  int root,
  MPIABI_Comm comm,
  MPIABI_Comm * intercomm,
  int * array_off_errcodes
) {
  return MPI_Comm_spawn(
    command,
    argv,
    maxprocs,
    (MPI_Info)(WPI_Info)info,
    root,
    (MPI_Comm)(WPI_Comm)comm,
    (MPI_Comm *)(WPI_CommPtr)intercomm,
    array_off_errcodes
  );
}